

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O3

int run_test_threadpool_cancel_work(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  long lVar2;
  int64_t eval_b;
  int64_t eval_a;
  cancel_info ci;
  uv_work_t reqs [16];
  uv_timer_t local_8a0;
  uv_work_t local_828 [16];
  
  loop = uv_default_loop();
  saturate_threadpool();
  lVar2 = 0;
  do {
    iVar1 = uv_queue_work(loop,(uv_work_t *)((long)local_828[0].reserved + lVar2 + -0x18),work2_cb,
                          done2_cb);
    if (iVar1 != 0) {
      run_test_threadpool_cancel_work_cold_1();
      goto LAB_001d0bb7;
    }
    lVar2 = lVar2 + 0x80;
  } while (lVar2 != 0x800);
  iVar1 = uv_timer_init(loop,&local_8a0);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&local_8a0,timer_cb,10,0);
    if (iVar1 != 0) goto LAB_001d0bc6;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001d0bd5;
    if (timer_cb_called != 1) goto LAB_001d0be4;
    if (done2_cb_called == 0x10) {
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      iVar1 = uv_loop_close(loop);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001d0c02;
    }
  }
  else {
LAB_001d0bb7:
    run_test_threadpool_cancel_work_cold_2();
LAB_001d0bc6:
    run_test_threadpool_cancel_work_cold_3();
LAB_001d0bd5:
    run_test_threadpool_cancel_work_cold_4();
LAB_001d0be4:
    run_test_threadpool_cancel_work_cold_5();
  }
  run_test_threadpool_cancel_work_cold_6();
LAB_001d0c02:
  run_test_threadpool_cancel_work_cold_7();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
          ,0x99,"0 && \"work2_cb called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(threadpool_cancel_work) {
  struct cancel_info ci;
  uv_work_t reqs[16];
  uv_loop_t* loop;
  unsigned i;

  INIT_CANCEL_INFO(&ci, reqs);
  loop = uv_default_loop();
  saturate_threadpool();

  for (i = 0; i < ARRAY_SIZE(reqs); i++)
    ASSERT_OK(uv_queue_work(loop, reqs + i, work2_cb, done2_cb));

  ASSERT_OK(uv_timer_init(loop, &ci.timer_handle));
  ASSERT_OK(uv_timer_start(&ci.timer_handle, timer_cb, 10, 0));
  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));
  ASSERT_EQ(1, timer_cb_called);
  ASSERT_EQ(ARRAY_SIZE(reqs), done2_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}